

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElabVisitors.h
# Opt level: O3

bool __thiscall
slang::ast::DiagnosticVisitor::tryApplyFromCache(DiagnosticVisitor *this,InstanceSymbol *symbol)

{
  size_t *psVar1;
  group_type_pointer pgVar2;
  group_type_pointer pgVar3;
  undefined4 uVar4;
  group_type_pointer pgVar5;
  ulong uVar6;
  Compilation *pCVar7;
  value_type_pointer ppVar8;
  InstanceSymbol *pIVar9;
  int iVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  bool bVar13;
  byte bVar14;
  uint uVar15;
  ulong uVar16;
  pointer ppVar17;
  table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::InstanceCacheKey,slang::ast::DiagnosticVisitor::InstanceCacheEntry>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::InstanceCacheKey,void>,std::equal_to<slang::ast::InstanceCacheKey>,std::allocator<std::pair<slang::ast::InstanceCacheKey_const,slang::ast::DiagnosticVisitor::InstanceCacheEntry>>>
  *arrays_;
  ulong uVar18;
  ulong uVar19;
  InstanceBodySymbol *args_2;
  ulong hash;
  IfacePortDriver *ifacePortDriver;
  InstanceCacheKey *other;
  long lVar20;
  ulong uVar21;
  not_null<const_slang::ast::InstanceSymbol_*> ifacePortDriver_00;
  bool bVar22;
  uchar uVar23;
  uchar uVar25;
  uchar uVar26;
  byte bVar27;
  undefined1 auVar24 [16];
  uchar uVar29;
  uchar uVar30;
  uchar uVar31;
  byte bVar32;
  uchar uVar33;
  uchar uVar34;
  uchar uVar35;
  byte bVar36;
  uchar uVar37;
  uchar uVar38;
  uchar uVar39;
  byte bVar40;
  undefined1 auVar28 [16];
  try_emplace_args_t local_ea;
  bool valid;
  ulong local_e8;
  ulong local_e0;
  ulong local_d8;
  ulong local_d0;
  table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::InstanceCacheKey,slang::ast::DiagnosticVisitor::InstanceCacheEntry>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::InstanceCacheKey,void>,std::equal_to<slang::ast::InstanceCacheKey>,std::allocator<std::pair<slang::ast::InstanceCacheKey_const,slang::ast::DiagnosticVisitor::InstanceCacheEntry>>>
  *local_c8;
  InstanceBodySymbol *local_c0;
  value_type_pointer local_b8;
  ulong local_b0;
  uchar local_a8;
  uchar uStack_a7;
  uchar uStack_a6;
  byte bStack_a5;
  uchar uStack_a4;
  uchar uStack_a3;
  uchar uStack_a2;
  byte bStack_a1;
  uchar uStack_a0;
  uchar uStack_9f;
  uchar uStack_9e;
  byte bStack_9d;
  uchar uStack_9c;
  uchar uStack_9b;
  uchar uStack_9a;
  byte bStack_99;
  uchar local_98;
  uchar uStack_97;
  uchar uStack_96;
  byte bStack_95;
  uchar uStack_94;
  uchar uStack_93;
  uchar uStack_92;
  byte bStack_91;
  uchar uStack_90;
  uchar uStack_8f;
  uchar uStack_8e;
  byte bStack_8d;
  uchar uStack_8c;
  uchar uStack_8b;
  uchar uStack_8a;
  byte bStack_89;
  uchar local_88;
  uchar uStack_87;
  uchar uStack_86;
  byte bStack_85;
  uchar uStack_84;
  uchar uStack_83;
  uchar uStack_82;
  byte bStack_81;
  uchar uStack_80;
  uchar uStack_7f;
  uchar uStack_7e;
  byte bStack_7d;
  uchar uStack_7c;
  uchar uStack_7b;
  uchar uStack_7a;
  byte bStack_79;
  InstanceCacheKey key;
  locator res;
  
  if ((((this->disableCache != false) || (symbol->resolvedConfig != (ResolvedConfig *)0x0)) ||
      (symbol->body->hierarchyOverrideNode != (HierarchyOverrideNode *)0x0)) ||
     ((symbol->body->flags).m_bits != '\0')) {
    return false;
  }
  valid = true;
  InstanceCacheKey::InstanceCacheKey(&key,symbol,&valid);
  if (valid == true) {
    auVar12._8_8_ = 0;
    auVar12._0_8_ = key.savedHash;
    arrays_ = (table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::InstanceCacheKey,slang::ast::DiagnosticVisitor::InstanceCacheEntry>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::InstanceCacheKey,void>,std::equal_to<slang::ast::InstanceCacheKey>,std::allocator<std::pair<slang::ast::InstanceCacheKey_const,slang::ast::DiagnosticVisitor::InstanceCacheEntry>>>
               *)&this->instanceCache;
    args_2 = symbol->body;
    hash = SUB168(ZEXT816(0x9e3779b97f4a7c15) * auVar12,8) ^
           SUB168(ZEXT816(0x9e3779b97f4a7c15) * auVar12,0);
    uVar18 = hash >> ((byte)(this->instanceCache).table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::InstanceCacheKey,_slang::ast::DiagnosticVisitor::InstanceCacheEntry>,_slang::hash<ast::InstanceCacheKey>,_std::equal_to<slang::ast::InstanceCacheKey>,_std::allocator<std::pair<const_slang::ast::InstanceCacheKey,_slang::ast::DiagnosticVisitor::InstanceCacheEntry>_>_>
                            .arrays.groups_size_index & 0x3f);
    lVar20 = (hash & 0xff) * 4;
    uVar23 = (&UNK_004a938c)[lVar20];
    uVar25 = (&UNK_004a938d)[lVar20];
    uVar26 = (&UNK_004a938e)[lVar20];
    bVar27 = (&UNK_004a938f)[lVar20];
    uVar16 = (ulong)((uint)hash & 7);
    uVar19 = 0;
    uVar21 = uVar18;
    uVar29 = uVar23;
    uVar30 = uVar25;
    uVar31 = uVar26;
    bVar32 = bVar27;
    uVar33 = uVar23;
    uVar34 = uVar25;
    uVar35 = uVar26;
    bVar36 = bVar27;
    uVar37 = uVar23;
    uVar38 = uVar25;
    uVar39 = uVar26;
    bVar40 = bVar27;
    do {
      pgVar5 = (this->instanceCache).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::InstanceCacheKey,_slang::ast::DiagnosticVisitor::InstanceCacheEntry>,_slang::hash<ast::InstanceCacheKey>,_std::equal_to<slang::ast::InstanceCacheKey>,_std::allocator<std::pair<const_slang::ast::InstanceCacheKey,_slang::ast::DiagnosticVisitor::InstanceCacheEntry>_>_>
               .arrays.groups_;
      pgVar2 = pgVar5 + uVar21;
      local_88 = pgVar2->m[0].n;
      uStack_87 = pgVar2->m[1].n;
      uStack_86 = pgVar2->m[2].n;
      bStack_85 = pgVar2->m[3].n;
      uStack_84 = pgVar2->m[4].n;
      uStack_83 = pgVar2->m[5].n;
      uStack_82 = pgVar2->m[6].n;
      bStack_81 = pgVar2->m[7].n;
      uStack_80 = pgVar2->m[8].n;
      uStack_7f = pgVar2->m[9].n;
      uStack_7e = pgVar2->m[10].n;
      bStack_7d = pgVar2->m[0xb].n;
      uStack_7c = pgVar2->m[0xc].n;
      uStack_7b = pgVar2->m[0xd].n;
      uStack_7a = pgVar2->m[0xe].n;
      bVar14 = pgVar2->m[0xf].n;
      auVar24[0] = -(local_88 == uVar23);
      auVar24[1] = -(uStack_87 == uVar25);
      auVar24[2] = -(uStack_86 == uVar26);
      auVar24[3] = -(bStack_85 == bVar27);
      auVar24[4] = -(uStack_84 == uVar29);
      auVar24[5] = -(uStack_83 == uVar30);
      auVar24[6] = -(uStack_82 == uVar31);
      auVar24[7] = -(bStack_81 == bVar32);
      auVar24[8] = -(uStack_80 == uVar33);
      auVar24[9] = -(uStack_7f == uVar34);
      auVar24[10] = -(uStack_7e == uVar35);
      auVar24[0xb] = -(bStack_7d == bVar36);
      auVar24[0xc] = -(uStack_7c == uVar37);
      auVar24[0xd] = -(uStack_7b == uVar38);
      auVar24[0xe] = -(uStack_7a == uVar39);
      auVar24[0xf] = -(bVar14 == bVar40);
      uVar15 = (uint)(ushort)((ushort)(SUB161(auVar24 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar24 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar24 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar24 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar24 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar24 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar24 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar24 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar24 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar24 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar24 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar24 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar24 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar24 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar24 >> 0x77,0) & 1) << 0xe);
      bStack_79 = bVar14;
      if (uVar15 != 0) {
        local_b8 = (this->instanceCache).table_.
                   super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::InstanceCacheKey,_slang::ast::DiagnosticVisitor::InstanceCacheEntry>,_slang::hash<ast::InstanceCacheKey>,_std::equal_to<slang::ast::InstanceCacheKey>,_std::allocator<std::pair<const_slang::ast::InstanceCacheKey,_slang::ast::DiagnosticVisitor::InstanceCacheEntry>_>_>
                   .arrays.elements_ + uVar21 * 0xf;
        local_e8 = uVar21;
        local_e0 = uVar19;
        local_d8 = uVar16;
        local_d0 = uVar18;
        local_c8 = arrays_;
        local_c0 = args_2;
        local_a8 = uVar23;
        uStack_a7 = uVar25;
        uStack_a6 = uVar26;
        bStack_a5 = bVar27;
        uStack_a4 = uVar29;
        uStack_a3 = uVar30;
        uStack_a2 = uVar31;
        bStack_a1 = bVar32;
        uStack_a0 = uVar33;
        uStack_9f = uVar34;
        uStack_9e = uVar35;
        bStack_9d = bVar36;
        uStack_9c = uVar37;
        uStack_9b = uVar38;
        uStack_9a = uVar39;
        bStack_99 = bVar40;
        do {
          local_b0 = (ulong)uVar15;
          iVar10 = 0;
          if (uVar15 != 0) {
            for (; (uVar15 >> iVar10 & 1) == 0; iVar10 = iVar10 + 1) {
            }
          }
          other = (InstanceCacheKey *)
                  ((long)&(local_b8->first).symbol.ptr + (ulong)(uint)(iVar10 << 6));
          bVar13 = InstanceCacheKey::operator==(&key,other);
          if (bVar13) {
            bVar13 = *(char *)&other[1].ifaceKeys.
                               super__Vector_base<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>,_std::allocator<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish == '\0';
            if (bVar13) {
              pCVar7 = this->compilation;
              pIVar9 = other[1].symbol.ptr;
              auVar11._8_8_ = 0;
              auVar11._0_8_ = pIVar9;
              uVar18 = SUB168(auVar11 * ZEXT816(0x9e3779b97f4a7c15),8) ^
                       SUB168(auVar11 * ZEXT816(0x9e3779b97f4a7c15),0);
              uVar16 = uVar18 >> ((byte)(pCVar7->instanceSideEffectMap).table_.
                                        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects>_>_>_>
                                        .arrays.groups_size_index & 0x3f);
              uVar4 = (&boost::unordered::detail::foa::
                        group15<boost::unordered::detail::foa::plain_integral>::
                        match_word(unsigned_long)::word)[uVar18 & 0xff];
              uVar19 = 0;
              goto LAB_002ee9c2;
            }
            if (bVar13) {
              std::__throw_bad_optional_access();
            }
            ppVar17 = other[1].ifaceKeys.
                      super__Vector_base<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>,_std::allocator<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            goto LAB_002eea69;
          }
          uVar15 = (uint)local_b0 - 1 & (uint)local_b0;
        } while (uVar15 != 0);
        bVar14 = pgVar5[uVar21].m[0xf].n;
        arrays_ = local_c8;
        uVar16 = local_d8;
        uVar18 = local_d0;
        uVar19 = local_e0;
        args_2 = local_c0;
        uVar21 = local_e8;
        uVar23 = local_a8;
        uVar25 = uStack_a7;
        uVar26 = uStack_a6;
        bVar27 = bStack_a5;
        uVar29 = uStack_a4;
        uVar30 = uStack_a3;
        uVar31 = uStack_a2;
        bVar32 = bStack_a1;
        uVar33 = uStack_a0;
        uVar34 = uStack_9f;
        uVar35 = uStack_9e;
        bVar36 = bStack_9d;
        uVar37 = uStack_9c;
        uVar38 = uStack_9b;
        uVar39 = uStack_9a;
        bVar40 = bStack_99;
      }
      if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             is_not_overflowed(unsigned_long)::shift)[uVar16] & bVar14) == 0) break;
      uVar6 = (this->instanceCache).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::InstanceCacheKey,_slang::ast::DiagnosticVisitor::InstanceCacheEntry>,_slang::hash<ast::InstanceCacheKey>,_std::equal_to<slang::ast::InstanceCacheKey>,_std::allocator<std::pair<const_slang::ast::InstanceCacheKey,_slang::ast::DiagnosticVisitor::InstanceCacheEntry>_>_>
              .arrays.groups_size_mask;
      lVar20 = uVar21 + uVar19;
      uVar19 = uVar19 + 1;
      uVar21 = lVar20 + 1U & uVar6;
    } while (uVar19 <= uVar6);
    if ((this->instanceCache).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::InstanceCacheKey,_slang::ast::DiagnosticVisitor::InstanceCacheEntry>,_slang::hash<ast::InstanceCacheKey>,_std::equal_to<slang::ast::InstanceCacheKey>,_std::allocator<std::pair<const_slang::ast::InstanceCacheKey,_slang::ast::DiagnosticVisitor::InstanceCacheEntry>_>_>
        .size_ctrl.size <
        (this->instanceCache).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::InstanceCacheKey,_slang::ast::DiagnosticVisitor::InstanceCacheEntry>,_slang::hash<ast::InstanceCacheKey>,_std::equal_to<slang::ast::InstanceCacheKey>,_std::allocator<std::pair<const_slang::ast::InstanceCacheKey,_slang::ast::DiagnosticVisitor::InstanceCacheEntry>_>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::InstanceCacheKey,slang::ast::DiagnosticVisitor::InstanceCacheEntry>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::InstanceCacheKey,void>,std::equal_to<slang::ast::InstanceCacheKey>,std::allocator<std::pair<slang::ast::InstanceCacheKey_const,slang::ast::DiagnosticVisitor::InstanceCacheEntry>>>
      ::
      nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::InstanceCacheKey,slang::ast::InstanceBodySymbol_const&>
                (&res,arrays_,(arrays_type *)arrays_,uVar18,hash,&local_ea,&key,args_2);
      psVar1 = &(this->instanceCache).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::InstanceCacheKey,_slang::ast::DiagnosticVisitor::InstanceCacheEntry>,_slang::hash<ast::InstanceCacheKey>,_std::equal_to<slang::ast::InstanceCacheKey>,_std::allocator<std::pair<const_slang::ast::InstanceCacheKey,_slang::ast::DiagnosticVisitor::InstanceCacheEntry>_>_>
                .size_ctrl.size;
      *psVar1 = *psVar1 + 1;
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::InstanceCacheKey,slang::ast::DiagnosticVisitor::InstanceCacheEntry>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::InstanceCacheKey,void>,std::equal_to<slang::ast::InstanceCacheKey>,std::allocator<std::pair<slang::ast::InstanceCacheKey_const,slang::ast::DiagnosticVisitor::InstanceCacheEntry>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::InstanceCacheKey,slang::ast::InstanceBodySymbol_const&>
                (&res,arrays_,hash,&local_ea,&key,args_2);
    }
  }
LAB_002eea74:
  bVar22 = false;
  goto LAB_002eea76;
code_r0x002eea15:
  uVar15 = uVar15 - 1 & uVar15;
  if (uVar15 == 0) goto LAB_002eea21;
  goto LAB_002eea07;
  while( true ) {
    uVar21 = (pCVar7->instanceSideEffectMap).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects>_>_>_>
             .arrays.groups_size_mask;
    lVar20 = uVar16 + uVar19;
    uVar19 = uVar19 + 1;
    uVar16 = lVar20 + 1U & uVar21;
    if (uVar21 < uVar19) break;
LAB_002ee9c2:
    pgVar3 = (pCVar7->instanceSideEffectMap).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects>_>_>_>
             .arrays.groups_ + uVar16;
    local_98 = pgVar3->m[0].n;
    uStack_97 = pgVar3->m[1].n;
    uStack_96 = pgVar3->m[2].n;
    bStack_95 = pgVar3->m[3].n;
    uStack_94 = pgVar3->m[4].n;
    uStack_93 = pgVar3->m[5].n;
    uStack_92 = pgVar3->m[6].n;
    bStack_91 = pgVar3->m[7].n;
    uStack_90 = pgVar3->m[8].n;
    uStack_8f = pgVar3->m[9].n;
    uStack_8e = pgVar3->m[10].n;
    bStack_8d = pgVar3->m[0xb].n;
    uStack_8c = pgVar3->m[0xc].n;
    uStack_8b = pgVar3->m[0xd].n;
    uStack_8a = pgVar3->m[0xe].n;
    bStack_89 = pgVar3->m[0xf].n;
    uVar23 = (uchar)uVar4;
    auVar28[0] = -(local_98 == uVar23);
    uVar25 = (uchar)((uint)uVar4 >> 8);
    auVar28[1] = -(uStack_97 == uVar25);
    uVar26 = (uchar)((uint)uVar4 >> 0x10);
    auVar28[2] = -(uStack_96 == uVar26);
    bVar27 = (byte)((uint)uVar4 >> 0x18);
    auVar28[3] = -(bStack_95 == bVar27);
    auVar28[4] = -(uStack_94 == uVar23);
    auVar28[5] = -(uStack_93 == uVar25);
    auVar28[6] = -(uStack_92 == uVar26);
    auVar28[7] = -(bStack_91 == bVar27);
    auVar28[8] = -(uStack_90 == uVar23);
    auVar28[9] = -(uStack_8f == uVar25);
    auVar28[10] = -(uStack_8e == uVar26);
    auVar28[0xb] = -(bStack_8d == bVar27);
    auVar28[0xc] = -(uStack_8c == uVar23);
    auVar28[0xd] = -(uStack_8b == uVar25);
    auVar28[0xe] = -(uStack_8a == uVar26);
    auVar28[0xf] = -(bStack_89 == bVar27);
    uVar15 = (uint)(ushort)((ushort)(SUB161(auVar28 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar28 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar28 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar28 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar28 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar28 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar28 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar28 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar28 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar28 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar28 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar28 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar28 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar28 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar28 >> 0x77,0) & 1) << 0xe);
    if (uVar15 != 0) {
      ppVar8 = (pCVar7->instanceSideEffectMap).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects>_>_>_>
               .arrays.elements_;
LAB_002eea07:
      iVar10 = 0;
      if (uVar15 != 0) {
        for (; (uVar15 >> iVar10 & 1) == 0; iVar10 = iVar10 + 1) {
        }
      }
      if (pIVar9 != *(InstanceSymbol **)
                     ((long)&ppVar8[uVar16 * 0xf].first + (ulong)(uint)(iVar10 << 4)))
      goto code_r0x002eea15;
      ppVar17 = *(pointer *)
                 ((long)&ppVar8[uVar16 * 0xf].second._M_t.
                         super___uniq_ptr_impl<slang::ast::Compilation::InstanceSideEffects,_std::default_delete<slang::ast::Compilation::InstanceSideEffects>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_slang::ast::Compilation::InstanceSideEffects_*,_std::default_delete<slang::ast::Compilation::InstanceSideEffects>_>
                         .
                         super__Head_base<0UL,_slang::ast::Compilation::InstanceSideEffects_*,_false>
                 + (ulong)(uint)(iVar10 << 4));
      *(undefined1 *)
       &other[1].ifaceKeys.
        super__Vector_base<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>,_std::allocator<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = 1;
      other[1].ifaceKeys.
      super__Vector_base<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>,_std::allocator<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>_>_>
      ._M_impl.super__Vector_impl_data._M_start = ppVar17;
LAB_002eea69:
      if (ppVar17 == (pointer)0x0) goto LAB_002eea88;
      if (*(char *)&ppVar17[1].first.symbol.ptr == '\0') {
        bVar13 = false;
        bVar22 = false;
        if (*(pointer *)
             ((long)&(ppVar17->first).ifaceKeys.
                     super__Vector_base<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>,_std::allocator<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>_>_>
             + 0x10) != (pointer)(ppVar17->first).savedHash) goto LAB_002eea76;
        goto LAB_002eea8c;
      }
      goto LAB_002eea74;
    }
LAB_002eea21:
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[(uint)uVar18 & 7] & bStack_89) == 0) break;
  }
  *(undefined1 *)
   &other[1].ifaceKeys.
    super__Vector_base<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>,_std::allocator<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = 1;
  other[1].ifaceKeys.
  super__Vector_base<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>,_std::allocator<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
LAB_002eea88:
  bVar13 = true;
  ppVar17 = (pointer)0x0;
LAB_002eea8c:
  symbol->canonicalBody = (InstanceBodySymbol *)other[1].symbol.ptr;
  uVar15 = (this->compilation->options).flags.m_bits & 0x4000;
  bVar22 = uVar15 == 0;
  if ((char)(uVar15 >> 0xe) == '\0' && !bVar13) {
    pIVar9 = *(InstanceSymbol **)
              &(ppVar17->first).ifaceKeys.
               super__Vector_base<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>,_std::allocator<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>_>_>
               ._M_impl.super__Vector_impl_data;
    bVar22 = true;
    for (ifacePortDriver_00.ptr = (ppVar17->first).symbol.ptr; ifacePortDriver_00.ptr != pIVar9;
        ifacePortDriver_00.ptr =
             (InstanceSymbol *)((long)&(ifacePortDriver_00.ptr)->super_InstanceSymbolBase + 0x10)) {
      applyInstanceSideEffect(this,(IfacePortDriver *)ifacePortDriver_00.ptr,symbol);
    }
  }
LAB_002eea76:
  std::
  vector<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>,_std::allocator<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>_>_>
  ::~vector(&key.ifaceKeys);
  return bVar22;
}

Assistant:

bool tryApplyFromCache(const InstanceSymbol& symbol) {
        if (disableCache)
            return false;

        // We can use a cached version of this instance's body if we have already
        // visited an identical body elsewhere, with some caveats explained below.
        SLANG_ASSERT(symbol.getCanonicalBody() == nullptr);

        // Instances that are targeted by defparams, bind directives, or configuration rules,
        // or that are themselves created by a bind directive, cannot participate in caching.
        if (!isEligibleForCaching(symbol))
            return false;

        // "Identical" needs to take into account parameter values and interface ports,
        // since the types of members and expression can vary based on those. This is
        // computed in the InstanceCacheKey.
        //
        // Interface ports must be connected to instances that themselves follow the
        // restrictions on defparams, bind directives, and config rules. This is checked
        // in the InstanceCacheKey constructor and returned in the 'valid' parameter.
        bool valid = true;
        InstanceCacheKey key(symbol, valid);
        if (!valid)
            return false;

        auto [it, inserted] = instanceCache.try_emplace(std::move(key), symbol.body);
        if (inserted)
            return false;

        // If we haven't resolved the side effects entry yet do that now.
        // We do this opportunistically here because we know we have a cache hit.
        auto& entry = it->second;
        if (!entry.sideEffects) {
            if (auto sideEffectIt = compilation.instanceSideEffectMap.find(entry.canonicalBody);
                sideEffectIt != compilation.instanceSideEffectMap.end()) {
                entry.sideEffects = sideEffectIt->second.get();
            }
            else {
                entry.sideEffects = nullptr;
            }
        }

        // If any hierarchical names extend upward out of the instance we won't consider
        // it for caching, since the names could be different based on the context.
        // This could be optimized in the future by having another layer of caching based
        // on what the name resolves to for each instance.
        auto sideEffects = entry.sideEffects.value();
        if (sideEffects && (sideEffects->cannotCache || !sideEffects->upwardNames.empty())) {
            return false;
        }

        // Assuming we find an appropriately cached instance, we will store a pointer to it
        // in other instances to facilitate downstream consumers in not needing to recreate
        // this duplication detection logic again.
        symbol.setCanonicalBody(*entry.canonicalBody);
        if (compilation.hasFlag(CompilationFlags::DisableInstanceCaching))
            return false;

        // Apply any side effects that come from the cached instance
        // in the context of the current instance.
        if (sideEffects) {
            for (auto& ifacePortDriver : sideEffects->ifacePortDrivers)
                applyInstanceSideEffect(ifacePortDriver, symbol);
        }

        return true;
    }